

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_statistics.cpp
# Opt level: O3

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::ColumnStatistics::Copy(ColumnStatistics *this)

{
  long lVar1;
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseStatistics *in_RSI;
  pointer *__ptr;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar3;
  undefined1 local_81;
  DistinctStatistics local_80;
  BaseStatistics local_68;
  
  BaseStatistics::Copy(&local_68,in_RSI);
  lVar1._0_1_ = in_RSI[1].type.id_;
  lVar1._1_1_ = in_RSI[1].type.physical_type_;
  lVar1._2_6_ = *(undefined6 *)&in_RSI[1].type.field_0x2;
  if (lVar1 == 0) {
    local_80.log.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
    _M_t.super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
    super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
         (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>
         )0x0;
  }
  else {
    unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>::
    operator->((unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                *)(in_RSI + 1));
    DistinctStatistics::Copy(&local_80);
  }
  local_80.sample_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ColumnStatistics,std::allocator<duckdb::ColumnStatistics>,duckdb::BaseStatistics,duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80.total_count,
             (ColumnStatistics **)&local_80.sample_count,
             (allocator<duckdb::ColumnStatistics> *)&local_81,&local_68,
             (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
              *)&local_80);
  *(__atomic_base<unsigned_long> *)&(this->stats).type =
       local_80.sample_count.super___atomic_base<unsigned_long>._M_i;
  (this->stats).type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80.total_count.super___atomic_base<unsigned_long>._M_i;
  if (local_80.total_count.super___atomic_base<unsigned_long>._M_i != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)((long)local_80.total_count.super___atomic_base<unsigned_long>._M_i + 8U) =
           *(int *)((long)local_80.total_count.super___atomic_base<unsigned_long>._M_i + 8U) + 1;
      UNLOCK();
      if (local_80.total_count.super___atomic_base<unsigned_long>._M_i == 0) goto LAB_0176c972;
    }
    else {
      *(int *)((long)local_80.total_count.super___atomic_base<unsigned_long>._M_i + 8U) =
           *(int *)((long)local_80.total_count.super___atomic_base<unsigned_long>._M_i + 8U) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.total_count.super___atomic_base<unsigned_long>._M_i);
  }
LAB_0176c972:
  uVar2.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
  super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl =
       (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
       (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)local_80.log;
  if (local_80.log.super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
      _M_t.super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>.
      super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true,_true>)
      0x0) {
    if (*(void **)(uint8_t *)
                  local_80.log.
                  super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
                  .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl != (void *)0x0)
    {
      operator_delete(*(void **)(uint8_t *)
                                local_80.log.
                                super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
                                .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl);
    }
    operator_delete((void *)uVar2.
                            super_unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::HyperLogLog_*,_std::default_delete<duckdb::HyperLogLog>_>
                            .super__Head_base<0UL,_duckdb::HyperLogLog_*,_false>._M_head_impl);
  }
  BaseStatistics::~BaseStatistics(&local_68);
  sVar3.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ColumnStatistics> ColumnStatistics::Copy() const {
	return make_shared_ptr<ColumnStatistics>(stats.Copy(), distinct_stats ? distinct_stats->Copy() : nullptr);
}